

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMDBitSet.cpp
# Opt level: O1

int __thiscall OpenMD::OpenMDBitSet::nextOnBit(OpenMDBitSet *this,int fromIndex)

{
  long lVar1;
  ulong uVar2;
  
  if (-1 < fromIndex) {
    lVar1 = (long)(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar2 = (ulong)(uint)fromIndex;
    while( true ) {
      uVar2 = uVar2 + 1;
      fromIndex = fromIndex + 1;
      if ((int)((*(int *)&(this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                (int)lVar1) * 8 +
               (this->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset) <= fromIndex)
      break;
      if ((*(ulong *)(lVar1 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0) {
        return fromIndex;
      }
    }
  }
  return -1;
}

Assistant:

int OpenMDBitSet::nextOnBit(int fromIndex) const {
    if (fromIndex <= -1) {
      // in case -1 or other negative number is passed to this function
      return -1;
    }

    ++fromIndex;
    while (fromIndex < static_cast<int>(size())) {
      if (bitset_[fromIndex]) { return fromIndex; }
      ++fromIndex;
    }

    return -1;
  }